

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool tinyxml2::XMLUtil::ToInt64(char *str,int64_t *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long_long v;
  
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    pcVar3 = "%llx";
  }
  else {
    pcVar3 = "%lld";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3);
  if (iVar2 == 1) {
    *value = 0;
  }
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToInt64(const char* str, int64_t* value)
{
    if (IsPrefixHex(str)) {
        unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llx
        if (TIXML_SSCANF(str, "%llx", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
    else {
        long long v = 0;	// horrible syntax trick to make the compiler happy about %lld
        if (TIXML_SSCANF(str, "%lld", &v) == 1) {
            *value = static_cast<int64_t>(v);
            return true;
        }
    }
	return false;
}